

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_parser.cpp
# Opt level: O2

shared_ptr<Node>
ParseExpression<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
          (__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *current,
          __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> end,
          uint precedence)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  mapped_type *pmVar4;
  logic_error *plVar5;
  uint in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  shared_ptr<Node> sVar7;
  initializer_list<std::pair<const_LogicalOperation,_unsigned_int>_> __l;
  LogicalOperation logical_operation;
  uint local_8c;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
  precedences;
  __shared_ptr<LogicalOperationNode,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(in_register_00000014,precedence);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((end._M_current)->value)._M_dataplus._M_p;
  current->_M_current = (Token *)0x0;
  current[1]._M_current = (Token *)0x0;
  if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var6._M_pi) {
    local_8c = in_ECX;
    if (*(int *)&pbVar2[1]._M_dataplus._M_p == 5) {
      ((end._M_current)->value)._M_dataplus._M_p = (pointer)&pbVar2[1]._M_string_length;
      ParseExpression<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
                ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                 &precedences,end,precedence);
      std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)current,
                 (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)&precedences);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &precedences._M_t._M_impl.super__Rb_tree_header);
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((end._M_current)->value)._M_dataplus._M_p;
      if ((pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var6._M_pi) || (*(int *)&pbVar2[1]._M_dataplus._M_p != 6)) {
        plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar5,"Missing right paren");
        __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      ((end._M_current)->value)._M_dataplus._M_p = (pointer)&pbVar2[1]._M_string_length;
    }
    else {
      ParseComparison<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
                ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                 &precedences,end);
      std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)current,
                 (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)&precedences);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &precedences._M_t._M_impl.super__Rb_tree_header);
    }
    local_48._M_ptr = (element_type *)0x100000000;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x200000001;
    __l._M_len = 2;
    __l._M_array = (iterator)&local_48;
    std::
    map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
    ::map(&precedences,__l,(less<LogicalOperation> *)&local_88,(allocator_type *)&logical_operation)
    ;
    while (pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((end._M_current)->value)._M_dataplus._M_p,
          pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var6._M_pi
          ) {
      iVar1 = *(int *)&pbVar2[1]._M_dataplus._M_p;
      if (iVar1 != 3) {
        if (iVar1 != 6) {
          plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar5,"Expected logic operation");
          __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        break;
      }
      bVar3 = std::operator==(pbVar2,"AND");
      logical_operation = (LogicalOperation)bVar3;
      pmVar4 = std::
               map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
               ::at(&precedences,(key_type *)&logical_operation);
      if (*pmVar4 <= local_8c) break;
      ((end._M_current)->value)._M_dataplus._M_p = ((end._M_current)->value)._M_dataplus._M_p + 0x28
      ;
      ParseExpression<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
                (&local_88,end,precedence);
      std::
      make_shared<LogicalOperationNode,LogicalOperation_const&,std::shared_ptr<Node>&,std::shared_ptr<Node>>
                ((LogicalOperation *)&local_48,(shared_ptr<Node> *)&logical_operation,
                 (shared_ptr<Node> *)current);
      std::__shared_ptr<Node,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Node,(__gnu_cxx::_Lock_policy)2> *)current,&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
    }
    std::
    _Rb_tree<LogicalOperation,_std::pair<const_LogicalOperation,_unsigned_int>,_std::_Select1st<std::pair<const_LogicalOperation,_unsigned_int>_>,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
    ::~_Rb_tree(&precedences._M_t);
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
  }
  sVar7.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar7.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)current;
  return (shared_ptr<Node>)sVar7.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Node> ParseExpression(It& current, It end, unsigned precedence) {
    if (current == end) {
        return shared_ptr<Node>();
    }

    shared_ptr<Node> left;

    if (current->type == TokenType::PAREN_LEFT) {
        ++current; // consume '('
        left = ParseExpression(current, end, 0u);
        if (current == end || current->type != TokenType::PAREN_RIGHT) {
            throw logic_error("Missing right paren");
        }
        ++current; // consume ')'
    } else {
        left = ParseComparison(current, end);
    }

    const map<LogicalOperation, unsigned> precedences = {
        {LogicalOperation::Or, 1},
        {LogicalOperation::And, 2}
    };

    while (current != end && current->type != TokenType::PAREN_RIGHT) {
        if (current->type != TokenType::LOGICAL_OP) {
            throw logic_error("Expected logic operation");
        }

        const auto logical_operation = current->value == "AND" ? LogicalOperation::And
                                                            : LogicalOperation::Or;
        const auto current_precedence = precedences.at(logical_operation);
        if (current_precedence <= precedence) {
            break;
        }

        ++current; // consume op

        left = make_shared<LogicalOperationNode>(
            logical_operation, left, ParseExpression(current, end, current_precedence)
        );
    }

    return left;
}